

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O1

int __thiscall RasterizerA3<4U>::init(RasterizerA3<4U> *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  BitWord *__ptr;
  Cell *__ptr_00;
  void *pvVar2;
  int in_EDX;
  int iVar3;
  size_t __size;
  ulong uVar4;
  size_t __size_00;
  
  iVar3 = (int)ctx;
  if (((this->super_CellRasterizer).super_Rasterizer._width == iVar3) &&
     ((this->super_CellRasterizer).super_Rasterizer._height == in_EDX)) {
    uVar1 = (*(this->super_CellRasterizer).super_Rasterizer._vptr_Rasterizer[3])(this);
    pvVar2 = (void *)(ulong)uVar1;
  }
  else {
    if (this->_bits != (BitWord *)0x0) {
      free(this->_bits);
      in_RAX = extraout_RAX;
    }
    if (this->_cells != (Cell *)0x0) {
      free(this->_cells);
      in_RAX = extraout_RAX_00;
    }
    (this->super_CellRasterizer).super_Rasterizer._width = iVar3;
    (this->super_CellRasterizer).super_Rasterizer._height = in_EDX;
    pvVar2 = (void *)CONCAT71((int7)((ulong)in_RAX >> 8),iVar3 != 0);
    if (iVar3 != 0 && in_EDX != 0) {
      uVar4 = ((long)iVar3 + 4U >> 2) + 0x3f >> 6;
      this->_bitStride = uVar4;
      __size_00 = uVar4 * (long)in_EDX * 8;
      __ptr = (BitWord *)malloc(__size_00);
      this->_bits = __ptr;
      this->_cellStride = (long)(iVar3 + 1);
      __size = (long)(iVar3 + 1) * (long)in_EDX * 8;
      __ptr_00 = (Cell *)malloc(__size);
      this->_cells = __ptr_00;
      if ((__ptr == (BitWord *)0x0) || (__ptr_00 == (Cell *)0x0)) {
        if (__ptr != (BitWord *)0x0) {
          free(__ptr);
        }
        if (__ptr_00 != (Cell *)0x0) {
          free(__ptr_00);
        }
        (this->super_CellRasterizer).super_Rasterizer._width = 0;
        (this->super_CellRasterizer).super_Rasterizer._height = 0;
        (this->_yBounds).start = 0x7fffffff;
        *(undefined8 *)&(this->_yBounds).end = 0;
        *(undefined8 *)((long)&this->_bitStride + 4) = 0;
        *(undefined8 *)((long)&this->_bits + 4) = 0;
        *(undefined8 *)((long)&this->_cellStride + 4) = 0;
        *(undefined4 *)((long)&this->_cells + 4) = 0;
        return 0;
      }
      (this->_yBounds).start = 0x7fffffff;
      (this->_yBounds).end = 0;
      memset(__ptr_00,0,__size);
      pvVar2 = memset(__ptr,0,__size_00);
    }
    else {
      (this->_yBounds).start = 0x7fffffff;
      *(undefined8 *)&(this->_yBounds).end = 0;
      *(undefined8 *)((long)&this->_bitStride + 4) = 0;
      *(undefined8 *)((long)&this->_bits + 4) = 0;
      *(undefined8 *)((long)&this->_cellStride + 4) = 0;
      *(undefined4 *)((long)&this->_cells + 4) = 0;
    }
  }
  return (int)CONCAT71((int7)((ulong)pvVar2 >> 8),1);
}

Assistant:

bool RasterizerA3<N>::init(int w, int h) noexcept {
  if (_width != w || _height != h) {
    if (_bits) std::free(_bits);
    if (_cells) std::free(_cells);

    _width = w;
    _height = h;

    if (w == 0 || h == 0) {
      _yBounds.reset();
      _bitStride = 0;
      _bits = nullptr;
      _cellStride = 0;
      _cells = nullptr;
      return true;
    }

    _bitStride = IntUtils::nBitWordsForNBits((size_t(w) + 1 + kPixelsPerOneBit - 1) / kPixelsPerOneBit);
    _bits = static_cast<BitWord*>(std::malloc(h * _bitStride * sizeof(BitWord)));

    _cellStride = w + 1;
    _cells = static_cast<Cell*>(std::malloc(h * _cellStride * sizeof(Cell)));

    if (!_bits || !_cells) {
      if (_bits) std::free(_bits);
      if (_cells) std::free(_cells);

      _width = 0;
      _height = 0;
      _yBounds.reset();

      _bitStride = 0;
      _bits = nullptr;
      _cellStride = 0;
      _cells = nullptr;

      return false;
    }

    _yBounds.reset();

    std::memset(_cells, 0, _height * _cellStride * sizeof(Cell));
    std::memset(_bits, 0, _height * _bitStride * sizeof(BitWord));
  }
  else {
    // This is much faster, will only clear the affected area.
    clear();
  }

  return true;
}